

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::C_DecryptUpdate
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pEncryptedData,
          CK_ULONG ulEncryptedDataLen,CK_BYTE_PTR pData,CK_ULONG_PTR pDataLen)

{
  CK_ULONG CVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Session *this_00;
  SymmetricAlgorithm *pSVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  uchar *__src;
  CK_RV CVar9;
  ulong local_a0;
  ByteString local_80;
  ByteString data;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  CVar9 = 400;
  if (this->isInitialised == true) {
    this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
    if (this_00 == (Session *)0x0) {
      CVar9 = 0xb3;
    }
    else if (pEncryptedData == (CK_BYTE_PTR)0x0 || pDataLen == (CK_ULONG_PTR)0x0) {
      Session::resetOp(this_00);
      CVar9 = 7;
    }
    else {
      iVar3 = Session::getOpType(this_00);
      CVar9 = 0x91;
      if (iVar3 == 3) {
        pSVar5 = Session::getSymmetricCryptoOp(this_00);
        if (pSVar5 == (SymmetricAlgorithm *)0x0) {
          CVar9 = 0x54;
        }
        else {
          pSVar5 = Session::getSymmetricCryptoOp(this_00);
          if ((pSVar5 != (SymmetricAlgorithm *)0x0) &&
             (bVar2 = Session::getAllowMultiPartOp(this_00), bVar2)) {
            iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[0xd])(pSVar5);
            uVar6 = CONCAT44(extraout_var,iVar3);
            iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[0x10])(pSVar5);
            lVar7 = CONCAT44(extraout_var_00,iVar3);
            local_a0 = lVar7 + ulEncryptedDataLen;
            iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[0x13])(pSVar5);
            if ((char)iVar3 != '\0') {
              uVar4 = (*pSVar5->_vptr_SymmetricAlgorithm[0xf])(pSVar5);
              local_a0 = (long)(int)((local_a0 - (uVar4 & 0xff)) / uVar6) * uVar6;
            }
            iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[0x14])(pSVar5,ulEncryptedDataLen);
            if ((char)iVar3 == '\0') {
              Session::resetOp(this_00);
              return 0x41;
            }
            if (pData == (CK_BYTE_PTR)0x0) {
              *pDataLen = local_a0;
              return 0;
            }
            if (*pDataLen < local_a0) {
              softHSMLog(7,"SymDecryptUpdate",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                         ,0xd8d,
                         "Output buffer too short   ulEncryptedDataLen: %#5x  output buffer size: %#5x  blockSize: %#3x  remainingSize: %#4x  maxSize: %#5x"
                         ,ulEncryptedDataLen,*pDataLen,uVar6,lVar7,local_a0);
              *pDataLen = local_a0;
              return 0x150;
            }
            ByteString::ByteString(&data,pEncryptedData,ulEncryptedDataLen);
            ByteString::ByteString(&local_80);
            iVar3 = (*pSVar5->_vptr_SymmetricAlgorithm[6])(pSVar5,&data,&local_80);
            if ((char)iVar3 == '\0') {
              CVar9 = 0x40;
              Session::resetOp(this_00);
            }
            else {
              CVar1 = *pDataLen;
              sVar8 = ByteString::size(&local_80);
              softHSMLog(7,"SymDecryptUpdate",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                         ,0xd9d,
                         "ulEncryptedDataLen: %#5x  output buffer size: %#5x  blockSize: %#3x  remainingSize: %#4x  maxSize: %#5x  decryptedData.size(): %#5x"
                         ,ulEncryptedDataLen,CVar1,uVar6,lVar7,local_a0,sVar8);
              uVar6 = *pDataLen;
              sVar8 = ByteString::size(&local_80);
              if (uVar6 < sVar8) {
                Session::resetOp(this_00);
                CVar1 = *pDataLen;
                sVar8 = ByteString::size(&local_80);
                CVar9 = 0x41;
                softHSMLog(3,"SymDecryptUpdate",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0xda4,
                           "DecryptUpdate returning too much data. Length of output data buffer is %i but %i bytes was returned by the decrypt."
                           ,CVar1,sVar8);
              }
              else {
                sVar8 = ByteString::size(&local_80);
                if (sVar8 != 0) {
                  __src = ByteString::byte_str(&local_80);
                  sVar8 = ByteString::size(&local_80);
                  memcpy(pData,__src,sVar8);
                }
                sVar8 = ByteString::size(&local_80);
                *pDataLen = sVar8;
                CVar9 = 0;
              }
            }
            local_80._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                      (&local_80.byteString.
                        super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
            data._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                      (&data.byteString.
                        super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
            return CVar9;
          }
          Session::resetOp(this_00);
        }
      }
    }
  }
  return CVar9;
}

Assistant:

CK_RV SoftHSM::C_DecryptUpdate(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pEncryptedData, CK_ULONG ulEncryptedDataLen, CK_BYTE_PTR pData, CK_ULONG_PTR pDataLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	if ((pEncryptedData == NULL_PTR) || (pDataLen == NULL_PTR))
	{
		session->resetOp();

		return CKR_ARGUMENTS_BAD;
	}

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_DECRYPT)
		return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getSymmetricCryptoOp() != NULL)
		return SymDecryptUpdate(session, pEncryptedData, ulEncryptedDataLen,
				  pData, pDataLen);
	else
		return CKR_FUNCTION_NOT_SUPPORTED;
}